

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Vec_IntRemap(Vec_Int_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  int local_1c;
  int i;
  Vec_Int_t *vMap_local;
  Vec_Int_t *p_local;
  
  for (local_1c = 0; local_1c < p->nSize; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(vMap,p->pArray[local_1c]);
    p->pArray[local_1c] = iVar1;
  }
  return;
}

Assistant:

static inline void Vec_IntRemap( Vec_Int_t * p, Vec_Int_t * vMap )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Vec_IntEntry(vMap, p->pArray[i]);
}